

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_crld.cc
# Opt level: O2

void * v2i_crld(X509V3_EXT_METHOD *method,X509V3_CTX *ctx,stack_st_CONF_VALUE *nval)

{
  char *__s1;
  int iVar1;
  OPENSSL_STACK *sk;
  size_t sVar2;
  CONF_VALUE *cnf;
  GENERAL_NAME *a;
  OPENSSL_STACK *pOVar3;
  DIST_POINT *pDVar4;
  DIST_POINT_NAME *pDVar5;
  CONF_VALUE *cnf_00;
  stack_st_GENERAL_NAME *psVar6;
  ulong i_00;
  size_t i;
  ulong i_01;
  
  sk = OPENSSL_sk_new_null();
  if (sk == (OPENSSL_STACK *)0x0) {
LAB_002d6c66:
    pOVar3 = (OPENSSL_STACK *)0x0;
LAB_002d6c69:
    a = (GENERAL_NAME *)0x0;
LAB_002d6c6b:
    GENERAL_NAME_free(a);
    GENERAL_NAMES_free((GENERAL_NAMES *)pOVar3);
    sk_DIST_POINT_pop_free((stack_st_DIST_POINT *)sk,DIST_POINT_free);
    sk = (OPENSSL_STACK *)0x0;
  }
  else {
    for (i_00 = 0; sVar2 = OPENSSL_sk_num((OPENSSL_STACK *)nval), i_00 < sVar2; i_00 = i_00 + 1) {
      cnf = (CONF_VALUE *)OPENSSL_sk_value((OPENSSL_STACK *)nval,i_00);
      if (cnf->value == (char *)0x0) {
        pOVar3 = (OPENSSL_STACK *)X509V3_get_section((X509V3_CTX *)ctx,cnf->name);
        if (pOVar3 == (OPENSSL_STACK *)0x0) goto LAB_002d6c66;
        pDVar4 = DIST_POINT_new();
        if (pDVar4 == (DIST_POINT *)0x0) {
LAB_002d6c3c:
          DIST_POINT_free(pDVar4);
          pOVar3 = (OPENSSL_STACK *)0x0;
          a = (GENERAL_NAME *)0x0;
          goto LAB_002d6c6b;
        }
        for (i_01 = 0; sVar2 = OPENSSL_sk_num(pOVar3), i_01 < sVar2; i_01 = i_01 + 1) {
          cnf_00 = (CONF_VALUE *)OPENSSL_sk_value(pOVar3,i_01);
          iVar1 = set_dist_point_name((DIST_POINT_NAME **)pDVar4,ctx,cnf_00);
          if (iVar1 < 1) {
            if (iVar1 < 0) goto LAB_002d6c3c;
            __s1 = cnf_00->name;
            iVar1 = strcmp(__s1,"reasons");
            if (iVar1 == 0) {
              iVar1 = set_reasons((ASN1_BIT_STRING **)&pDVar4->reasons,cnf_00->value);
              if (iVar1 == 0) goto LAB_002d6c3c;
            }
            else {
              iVar1 = strcmp(__s1,"CRLissuer");
              if (iVar1 == 0) {
                GENERAL_NAMES_free(pDVar4->CRLissuer);
                psVar6 = gnames_from_sectname(ctx,cnf_00->value);
                pDVar4->CRLissuer = (GENERAL_NAMES *)psVar6;
                if (psVar6 == (stack_st_GENERAL_NAME *)0x0) goto LAB_002d6c3c;
              }
            }
          }
        }
        sVar2 = OPENSSL_sk_push(sk,pDVar4);
        if (sVar2 == 0) {
          DIST_POINT_free(pDVar4);
          goto LAB_002d6c66;
        }
      }
      else {
        a = v2i_GENERAL_NAME((X509V3_EXT_METHOD *)method,(X509V3_CTX *)ctx,cnf);
        if (a == (GENERAL_NAME *)0x0) goto LAB_002d6c66;
        pOVar3 = (OPENSSL_STACK *)GENERAL_NAMES_new();
        if (pOVar3 == (OPENSSL_STACK *)0x0) {
          pOVar3 = (OPENSSL_STACK *)0x0;
          goto LAB_002d6c6b;
        }
        sVar2 = OPENSSL_sk_push(pOVar3,a);
        if (sVar2 == 0) goto LAB_002d6c6b;
        pDVar4 = DIST_POINT_new();
        if (pDVar4 == (DIST_POINT *)0x0) goto LAB_002d6c69;
        sVar2 = OPENSSL_sk_push(sk,pDVar4);
        if (sVar2 == 0) {
          DIST_POINT_free(pDVar4);
          goto LAB_002d6c69;
        }
        pDVar5 = DIST_POINT_NAME_new();
        pDVar4->distpoint = pDVar5;
        if (pDVar5 == (DIST_POINT_NAME *)0x0) goto LAB_002d6c69;
        (pDVar5->name).fullname = (GENERAL_NAMES *)pOVar3;
        pDVar4->distpoint->type = 0;
      }
    }
  }
  return sk;
}

Assistant:

static void *v2i_crld(const X509V3_EXT_METHOD *method, const X509V3_CTX *ctx,
                      const STACK_OF(CONF_VALUE) *nval) {
  STACK_OF(DIST_POINT) *crld = NULL;
  GENERAL_NAMES *gens = NULL;
  GENERAL_NAME *gen = NULL;
  if (!(crld = sk_DIST_POINT_new_null())) {
    goto err;
  }
  for (size_t i = 0; i < sk_CONF_VALUE_num(nval); i++) {
    DIST_POINT *point;
    const CONF_VALUE *cnf = sk_CONF_VALUE_value(nval, i);
    if (!cnf->value) {
      const STACK_OF(CONF_VALUE) *dpsect = X509V3_get_section(ctx, cnf->name);
      if (!dpsect) {
        goto err;
      }
      point = crldp_from_section(ctx, dpsect);
      if (!point) {
        goto err;
      }
      if (!sk_DIST_POINT_push(crld, point)) {
        DIST_POINT_free(point);
        goto err;
      }
    } else {
      if (!(gen = v2i_GENERAL_NAME(method, ctx, cnf))) {
        goto err;
      }
      if (!(gens = GENERAL_NAMES_new())) {
        goto err;
      }
      if (!sk_GENERAL_NAME_push(gens, gen)) {
        goto err;
      }
      gen = NULL;
      if (!(point = DIST_POINT_new())) {
        goto err;
      }
      if (!sk_DIST_POINT_push(crld, point)) {
        DIST_POINT_free(point);
        goto err;
      }
      if (!(point->distpoint = DIST_POINT_NAME_new())) {
        goto err;
      }
      point->distpoint->name.fullname = gens;
      point->distpoint->type = 0;
      gens = NULL;
    }
  }
  return crld;

err:
  GENERAL_NAME_free(gen);
  GENERAL_NAMES_free(gens);
  sk_DIST_POINT_pop_free(crld, DIST_POINT_free);
  return NULL;
}